

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelUri.cpp
# Opt level: O0

string * aeron::archive::ChannelUri::addSessionId
                   (string *__return_storage_ptr__,string *channel,int32_t sessionId)

{
  string local_d0;
  undefined1 local_b0 [8];
  ChannelUri channelUri;
  int32_t sessionId_local;
  string *channel_local;
  
  channelUri.tags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = sessionId;
  parse((ChannelUri *)local_b0,channel);
  std::__cxx11::to_string
            (&local_d0,
             channelUri.tags_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  put((ChannelUri *)local_b0,(string *)(anonymous_namespace)::SESSION_ID_PARAM_NAME_abi_cxx11_,
      &local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  toString_abi_cxx11_(__return_storage_ptr__,(ChannelUri *)local_b0);
  ~ChannelUri((ChannelUri *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::string ChannelUri::addSessionId(const std::string& channel, std::int32_t sessionId) {
    ChannelUri channelUri = ChannelUri::parse(channel);
    channelUri.put(SESSION_ID_PARAM_NAME, std::to_string(sessionId));
    return channelUri.toString();
}